

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cpp
# Opt level: O0

int __thiscall Directory::close(Directory *this,int __fd)

{
  Directory *this_local;
  
  if (this->dp != (void *)0x0) {
    closedir((DIR *)this->dp);
    this->dp = (void *)0x0;
  }
  return (int)this;
}

Assistant:

void Directory::close()
{
#ifdef _WIN32
  if(findFile != INVALID_HANDLE_VALUE)
  {
    FindClose((HANDLE)findFile);
    findFile = INVALID_HANDLE_VALUE;
  }
#else
  if(dp)
  {
    closedir((DIR*)dp);
    dp = 0;
  }
#endif
}